

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O3

void ihevc_intra_pred_luma_planar_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  UWORD8 UVar5;
  UWORD8 UVar6;
  UWORD8 UVar7;
  UWORD8 UVar8;
  UWORD8 UVar9;
  UWORD8 UVar10;
  UWORD8 UVar11;
  UWORD8 UVar12;
  bool bVar13;
  long lVar14;
  UWORD8 *pUVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  byte *pbVar19;
  ulong uVar20;
  int iVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar56 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar78;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ushort uVar89;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  ushort uVar90;
  short sVar91;
  ushort uVar94;
  short sVar95;
  ushort uVar96;
  short sVar97;
  ushort uVar98;
  short sVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  undefined1 in_XMM9 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ushort uVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  ushort uVar107;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  undefined1 auVar108 [16];
  ushort uVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  ushort uVar148;
  ushort uVar161;
  ushort uVar162;
  ushort uVar163;
  ushort uVar164;
  ushort uVar165;
  ushort uVar166;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  ushort uVar167;
  undefined1 auVar160 [16];
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  undefined1 auVar61 [16];
  undefined1 auVar46 [16];
  undefined1 auVar54 [16];
  undefined1 auVar62 [16];
  undefined1 auVar47 [16];
  undefined1 auVar55 [16];
  undefined1 auVar63 [16];
  short sVar64;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  undefined1 auVar118 [16];
  undefined1 auVar127 [16];
  undefined1 auVar119 [16];
  undefined1 auVar128 [16];
  undefined1 auVar120 [16];
  undefined1 auVar129 [16];
  undefined1 auVar121 [16];
  undefined1 auVar130 [16];
  undefined1 auVar122 [16];
  undefined1 auVar131 [16];
  undefined1 auVar123 [16];
  undefined1 auVar132 [16];
  undefined1 auVar124 [16];
  undefined1 auVar133 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  
  uVar4 = nt * 2;
  bVar2 = pu1_ref[(long)nt + -1];
  bVar3 = pu1_ref[(long)nt * 3 + 1];
  auVar23 = ZEXT216(CONCAT11(bVar2,bVar3));
  auVar23 = pshuflw(auVar23,auVar23,0);
  uVar22 = auVar23._0_4_;
  auVar32._4_4_ = uVar22;
  auVar32._0_4_ = uVar22;
  auVar32._8_4_ = uVar22;
  auVar32._12_4_ = uVar22;
  auVar23 = pshuflw(ZEXT416((uint)nt),ZEXT416((uint)nt),0);
  uVar22 = auVar23._0_4_;
  auVar116._4_4_ = uVar22;
  auVar116._0_4_ = uVar22;
  auVar116._8_4_ = uVar22;
  auVar116._12_4_ = uVar22;
  sVar91 = auVar23._0_2_;
  sVar95 = auVar23._2_2_;
  if (nt == 0x20) {
    uVar20 = (ulong)uVar4;
    pUVar15 = pu1_dst + 0x10;
    lVar14 = 0x20;
    auVar116 = pmovsxbw(in_XMM9,0x1818181818181818);
    auVar23 = _DAT_00173f50;
    auVar136 = _DAT_00174040;
    do {
      auVar134 = pshufb(ZEXT116(pu1_ref[lVar14 + (uVar20 - 0x21)]),_DAT_001740d0);
      sVar97 = auVar136._0_2_;
      auVar149._0_2_ = sVar97 + -8;
      sVar99 = auVar136._2_2_;
      auVar149._2_2_ = sVar99 + -8;
      sVar26 = auVar136._4_2_;
      auVar149._4_2_ = sVar26 + -8;
      sVar27 = auVar136._6_2_;
      auVar149._6_2_ = sVar27 + -8;
      sVar28 = auVar136._8_2_;
      auVar149._8_2_ = sVar28 + -8;
      sVar29 = auVar136._10_2_;
      auVar149._10_2_ = sVar29 + -8;
      sVar30 = auVar136._12_2_;
      sVar31 = auVar136._14_2_;
      auVar149._12_2_ = sVar30 + -8;
      auVar149._14_2_ = sVar31 + -8;
      sVar64 = auVar23._0_2_;
      auVar147._0_2_ = sVar64 + 8;
      sVar69 = auVar23._2_2_;
      auVar147._2_2_ = sVar69 + 8;
      sVar70 = auVar23._4_2_;
      auVar147._4_2_ = sVar70 + 8;
      sVar71 = auVar23._6_2_;
      auVar147._6_2_ = sVar71 + 8;
      sVar72 = auVar23._8_2_;
      auVar147._8_2_ = sVar72 + 8;
      sVar73 = auVar23._10_2_;
      auVar147._10_2_ = sVar73 + 8;
      sVar74 = auVar23._12_2_;
      sVar75 = auVar23._14_2_;
      auVar147._12_2_ = sVar74 + 8;
      auVar147._14_2_ = sVar75 + 8;
      auVar104._0_2_ = sVar97 + -0x10;
      auVar104._2_2_ = sVar99 + -0x10;
      auVar104._4_2_ = sVar26 + -0x10;
      auVar104._6_2_ = sVar27 + -0x10;
      auVar104._8_2_ = sVar28 + -0x10;
      auVar104._10_2_ = sVar29 + -0x10;
      auVar104._12_2_ = sVar30 + -0x10;
      auVar104._14_2_ = sVar31 + -0x10;
      auVar68._0_2_ = sVar64 + 0x10;
      auVar68._2_2_ = sVar69 + 0x10;
      auVar68._4_2_ = sVar70 + 0x10;
      auVar68._6_2_ = sVar71 + 0x10;
      auVar68._8_2_ = sVar72 + 0x10;
      auVar68._10_2_ = sVar73 + 0x10;
      auVar68._12_2_ = sVar74 + 0x10;
      auVar68._14_2_ = sVar75 + 0x10;
      pUVar1 = pu1_ref + uVar20 + 1;
      auVar63._0_14_ = auVar134._0_14_;
      auVar63[0xe] = auVar134[7];
      auVar63[0xf] = pUVar1[7];
      auVar62._14_2_ = auVar63._14_2_;
      auVar62._0_13_ = auVar134._0_13_;
      auVar62[0xd] = pUVar1[6];
      auVar61._13_3_ = auVar62._13_3_;
      auVar61._0_12_ = auVar134._0_12_;
      auVar61[0xc] = auVar134[6];
      auVar60._12_4_ = auVar61._12_4_;
      auVar60._0_11_ = auVar134._0_11_;
      auVar60[0xb] = pUVar1[5];
      auVar59._11_5_ = auVar60._11_5_;
      auVar59._0_10_ = auVar134._0_10_;
      auVar59[10] = auVar134[5];
      auVar58._10_6_ = auVar59._10_6_;
      auVar58._0_9_ = auVar134._0_9_;
      auVar58[9] = pUVar1[4];
      auVar57._9_7_ = auVar58._9_7_;
      auVar57._0_8_ = auVar134._0_8_;
      auVar57[8] = auVar134[4];
      auVar56._8_8_ = auVar57._8_8_;
      auVar56[7] = pUVar1[3];
      auVar56[6] = auVar134[3];
      auVar56[5] = pUVar1[2];
      auVar56[4] = auVar134[2];
      auVar56[3] = pUVar1[1];
      auVar56[2] = auVar134[1];
      auVar56[0] = auVar134[0];
      auVar56[1] = *pUVar1;
      auVar160[1] = pUVar1[8];
      auVar160[0] = auVar134[8];
      auVar160[2] = auVar134[9];
      auVar160[3] = pUVar1[9];
      auVar160[4] = auVar134[10];
      auVar160[5] = pUVar1[10];
      auVar160[6] = auVar134[0xb];
      auVar160[7] = pUVar1[0xb];
      auVar160[8] = auVar134[0xc];
      auVar160[9] = pUVar1[0xc];
      auVar160[10] = auVar134[0xd];
      auVar160[0xb] = pUVar1[0xd];
      auVar160[0xc] = auVar134[0xe];
      auVar160[0xd] = pUVar1[0xe];
      auVar160[0xe] = auVar134[0xf];
      auVar160[0xf] = pUVar1[0xf];
      pUVar1 = pu1_ref + uVar20 + 0x11;
      auVar160 = pmaddubsw(auVar160,auVar149);
      auVar80[0xe] = auVar134[7];
      auVar80._0_14_ = auVar63._0_14_;
      auVar80[0xf] = pUVar1[7];
      auVar125._14_2_ = auVar80._14_2_;
      auVar125[0xd] = pUVar1[6];
      auVar125._0_13_ = auVar62._0_13_;
      auVar145._13_3_ = auVar125._13_3_;
      auVar145[0xc] = auVar134[6];
      auVar145._0_12_ = auVar61._0_12_;
      auVar158._12_4_ = auVar145._12_4_;
      auVar158[0xb] = pUVar1[5];
      auVar158._0_11_ = auVar60._0_11_;
      auVar106._11_5_ = auVar158._11_5_;
      auVar106[10] = auVar134[5];
      auVar106._0_10_ = auVar59._0_10_;
      auVar39._10_6_ = auVar106._10_6_;
      auVar39[9] = pUVar1[4];
      auVar39._0_9_ = auVar58._0_9_;
      auVar38._9_7_ = auVar39._9_7_;
      auVar38[8] = auVar134[4];
      auVar38._0_8_ = auVar57._0_8_;
      auVar37._8_8_ = auVar38._8_8_;
      auVar37[7] = pUVar1[3];
      auVar37[6] = auVar134[3];
      auVar37[5] = pUVar1[2];
      auVar37[4] = auVar134[2];
      auVar37[3] = pUVar1[1];
      auVar37[2] = auVar134[1];
      auVar37[1] = *pUVar1;
      auVar37[0] = auVar56[0];
      auVar149 = pmaddubsw(auVar37,auVar104);
      auVar105._0_2_ = sVar97 + -0x18;
      auVar105._2_2_ = sVar99 + -0x18;
      auVar105._4_2_ = sVar26 + -0x18;
      auVar105._6_2_ = sVar27 + -0x18;
      auVar105._8_2_ = sVar28 + -0x18;
      auVar105._10_2_ = sVar29 + -0x18;
      auVar105._12_2_ = sVar30 + -0x18;
      auVar105._14_2_ = sVar31 + -0x18;
      auVar135[1] = pUVar1[8];
      auVar135[0] = auVar134[8];
      auVar135[2] = auVar134[9];
      auVar135[3] = pUVar1[9];
      auVar135[4] = auVar134[10];
      auVar135[5] = pUVar1[10];
      auVar135[6] = auVar134[0xb];
      auVar135[7] = pUVar1[0xb];
      auVar135[8] = auVar134[0xc];
      auVar135[9] = pUVar1[0xc];
      auVar135[10] = auVar134[0xd];
      auVar135[0xb] = pUVar1[0xd];
      auVar135[0xc] = auVar134[0xe];
      auVar135[0xd] = pUVar1[0xe];
      auVar135[0xe] = auVar134[0xf];
      auVar135[0xf] = pUVar1[0xf];
      auVar134._0_2_ = sVar64 + auVar116._0_2_;
      auVar134._2_2_ = sVar69 + auVar116._2_2_;
      auVar134._4_2_ = sVar70 + auVar116._4_2_;
      auVar134._6_2_ = sVar71 + auVar116._6_2_;
      auVar134._8_2_ = sVar72 + auVar116._8_2_;
      auVar134._10_2_ = sVar73 + auVar116._10_2_;
      auVar134._12_2_ = sVar74 + auVar116._12_2_;
      auVar134._14_2_ = sVar75 + auVar116._14_2_;
      auVar158 = pmaddubsw(auVar135,auVar105);
      auVar145 = pmaddubsw(auVar32,auVar147);
      auVar106 = pmaddubsw(auVar32,auVar68);
      auVar125 = pmaddubsw(auVar32,auVar134);
      auVar80 = pmaddubsw(auVar32,auVar23);
      auVar23 = pmaddubsw(auVar56,auVar136);
      uVar78 = (ushort)(auVar80._0_2_ + sVar91 + auVar23._0_2_) >> 6;
      uVar83 = (ushort)(auVar80._2_2_ + sVar95 + auVar23._2_2_) >> 6;
      uVar84 = (ushort)(auVar80._4_2_ + sVar91 + auVar23._4_2_) >> 6;
      uVar85 = (ushort)(auVar80._6_2_ + sVar95 + auVar23._6_2_) >> 6;
      uVar86 = (ushort)(auVar80._8_2_ + sVar91 + auVar23._8_2_) >> 6;
      uVar87 = (ushort)(auVar80._10_2_ + sVar95 + auVar23._10_2_) >> 6;
      uVar88 = (ushort)(auVar80._12_2_ + sVar91 + auVar23._12_2_) >> 6;
      uVar89 = (ushort)(auVar80._14_2_ + sVar95 + auVar23._14_2_) >> 6;
      uVar107 = (ushort)(auVar145._0_2_ + sVar91 + auVar160._0_2_) >> 6;
      uVar109 = (ushort)(auVar145._2_2_ + sVar95 + auVar160._2_2_) >> 6;
      uVar110 = (ushort)(auVar145._4_2_ + sVar91 + auVar160._4_2_) >> 6;
      uVar111 = (ushort)(auVar145._6_2_ + sVar95 + auVar160._6_2_) >> 6;
      uVar112 = (ushort)(auVar145._8_2_ + sVar91 + auVar160._8_2_) >> 6;
      uVar113 = (ushort)(auVar145._10_2_ + sVar95 + auVar160._10_2_) >> 6;
      uVar114 = (ushort)(auVar145._12_2_ + sVar91 + auVar160._12_2_) >> 6;
      uVar115 = (ushort)(auVar145._14_2_ + sVar95 + auVar160._14_2_) >> 6;
      uVar148 = (ushort)(auVar106._0_2_ + sVar91 + auVar149._0_2_) >> 6;
      uVar161 = (ushort)(auVar106._2_2_ + sVar95 + auVar149._2_2_) >> 6;
      uVar162 = (ushort)(auVar106._4_2_ + sVar91 + auVar149._4_2_) >> 6;
      uVar163 = (ushort)(auVar106._6_2_ + sVar95 + auVar149._6_2_) >> 6;
      uVar164 = (ushort)(auVar106._8_2_ + sVar91 + auVar149._8_2_) >> 6;
      uVar165 = (ushort)(auVar106._10_2_ + sVar95 + auVar149._10_2_) >> 6;
      uVar166 = (ushort)(auVar106._12_2_ + sVar91 + auVar149._12_2_) >> 6;
      uVar167 = (ushort)(auVar106._14_2_ + sVar95 + auVar149._14_2_) >> 6;
      uVar90 = (ushort)(auVar125._0_2_ + sVar91 + auVar158._0_2_) >> 6;
      uVar94 = (ushort)(auVar125._2_2_ + sVar95 + auVar158._2_2_) >> 6;
      uVar96 = (ushort)(auVar125._4_2_ + sVar91 + auVar158._4_2_) >> 6;
      uVar98 = (ushort)(auVar125._6_2_ + sVar95 + auVar158._6_2_) >> 6;
      uVar100 = (ushort)(auVar125._8_2_ + sVar91 + auVar158._8_2_) >> 6;
      uVar101 = (ushort)(auVar125._10_2_ + sVar95 + auVar158._10_2_) >> 6;
      uVar102 = (ushort)(auVar125._12_2_ + sVar91 + auVar158._12_2_) >> 6;
      uVar103 = (ushort)(auVar125._14_2_ + sVar95 + auVar158._14_2_) >> 6;
      pUVar15[-0x10] = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
      pUVar15[-0xf] = (uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 - (0xff < uVar83);
      pUVar15[-0xe] = (uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84);
      pUVar15[-0xd] = (uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85);
      pUVar15[-0xc] = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
      pUVar15[-0xb] = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
      pUVar15[-10] = (uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88);
      pUVar15[-9] = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89);
      pUVar15[-8] = (uVar107 != 0) * (uVar107 < 0x100) * (char)uVar107 - (0xff < uVar107);
      pUVar15[-7] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
      pUVar15[-6] = (uVar110 != 0) * (uVar110 < 0x100) * (char)uVar110 - (0xff < uVar110);
      pUVar15[-5] = (uVar111 != 0) * (uVar111 < 0x100) * (char)uVar111 - (0xff < uVar111);
      pUVar15[-4] = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
      pUVar15[-3] = (uVar113 != 0) * (uVar113 < 0x100) * (char)uVar113 - (0xff < uVar113);
      pUVar15[-2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)uVar114 - (0xff < uVar114);
      pUVar15[-1] = (uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115);
      *pUVar15 = (uVar148 != 0) * (uVar148 < 0x100) * (char)uVar148 - (0xff < uVar148);
      pUVar15[1] = (uVar161 != 0) * (uVar161 < 0x100) * (char)uVar161 - (0xff < uVar161);
      pUVar15[2] = (uVar162 != 0) * (uVar162 < 0x100) * (char)uVar162 - (0xff < uVar162);
      pUVar15[3] = (uVar163 != 0) * (uVar163 < 0x100) * (char)uVar163 - (0xff < uVar163);
      pUVar15[4] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
      pUVar15[5] = (uVar165 != 0) * (uVar165 < 0x100) * (char)uVar165 - (0xff < uVar165);
      pUVar15[6] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
      pUVar15[7] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
      pUVar15[8] = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
      pUVar15[9] = (uVar94 != 0) * (uVar94 < 0x100) * (char)uVar94 - (0xff < uVar94);
      pUVar15[10] = (uVar96 != 0) * (uVar96 < 0x100) * (char)uVar96 - (0xff < uVar96);
      pUVar15[0xb] = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
      pUVar15[0xc] = (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100);
      pUVar15[0xd] = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
      pUVar15[0xe] = (uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102);
      pUVar15[0xf] = (uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103);
      auVar136._0_2_ = sVar97 + -0x100;
      auVar136._2_2_ = sVar99 + -0x100;
      auVar136._4_2_ = sVar26 + -0x100;
      auVar136._6_2_ = sVar27 + -0x100;
      auVar136._8_2_ = sVar28 + -0x100;
      auVar136._10_2_ = sVar29 + -0x100;
      auVar136._12_2_ = sVar30 + -0x100;
      auVar136._14_2_ = sVar31 + -0x100;
      auVar23._0_2_ = sVar64 + 0x100;
      auVar23._2_2_ = sVar69 + 0x100;
      auVar23._4_2_ = sVar70 + 0x100;
      auVar23._6_2_ = sVar71 + 0x100;
      auVar23._8_2_ = sVar72 + 0x100;
      auVar23._10_2_ = sVar73 + 0x100;
      auVar23._12_2_ = sVar74 + 0x100;
      auVar23._14_2_ = sVar75 + 0x100;
      pUVar15 = pUVar15 + dst_strd;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  else if (nt == 0x10) {
    pbVar19 = pu1_ref + ((ulong)uVar4 - 1);
    uVar20 = 0xfffffffffffffffe;
    auVar36 = _DAT_00173ff0;
    auVar77 = _DAT_00173f50;
    uVar18 = uVar4;
    do {
      uVar18 = uVar18 - 2;
      auVar23 = pshufb(ZEXT116(*pbVar19),(undefined1  [16])0x0);
      auVar149 = pshufb(ZEXT116(pu1_ref[uVar18]),(undefined1  [16])0x0);
      sVar64 = auVar36._0_2_;
      auVar92._0_2_ = sVar64 + -0x100;
      sVar69 = auVar36._2_2_;
      auVar92._2_2_ = sVar69 + -0x100;
      sVar70 = auVar36._4_2_;
      auVar92._4_2_ = sVar70 + -0x100;
      sVar71 = auVar36._6_2_;
      auVar92._6_2_ = sVar71 + -0x100;
      sVar72 = auVar36._8_2_;
      auVar92._8_2_ = sVar72 + -0x100;
      sVar73 = auVar36._10_2_;
      auVar92._10_2_ = sVar73 + -0x100;
      sVar74 = auVar36._12_2_;
      sVar75 = auVar36._14_2_;
      auVar92._12_2_ = sVar74 + -0x100;
      auVar92._14_2_ = sVar75 + -0x100;
      sVar97 = auVar77._0_2_;
      auVar34._0_2_ = sVar97 + 0x100;
      sVar99 = auVar77._2_2_;
      auVar34._2_2_ = sVar99 + 0x100;
      sVar26 = auVar77._4_2_;
      auVar34._4_2_ = sVar26 + 0x100;
      sVar27 = auVar77._6_2_;
      auVar34._6_2_ = sVar27 + 0x100;
      sVar28 = auVar77._8_2_;
      auVar34._8_2_ = sVar28 + 0x100;
      sVar29 = auVar77._10_2_;
      auVar34._10_2_ = sVar29 + 0x100;
      sVar30 = auVar77._12_2_;
      sVar31 = auVar77._14_2_;
      auVar34._12_2_ = sVar30 + 0x100;
      auVar34._14_2_ = sVar31 + 0x100;
      auVar159._0_2_ = sVar64 + -8;
      auVar159._2_2_ = sVar69 + -8;
      auVar159._4_2_ = sVar70 + -8;
      auVar159._6_2_ = sVar71 + -8;
      auVar159._8_2_ = sVar72 + -8;
      auVar159._10_2_ = sVar73 + -8;
      auVar159._12_2_ = sVar74 + -8;
      auVar159._14_2_ = sVar75 + -8;
      auVar25._0_2_ = sVar97 + 8;
      auVar25._2_2_ = sVar99 + 8;
      auVar25._4_2_ = sVar26 + 8;
      auVar25._6_2_ = sVar27 + 8;
      auVar25._8_2_ = sVar28 + 8;
      auVar25._10_2_ = sVar29 + 8;
      auVar25._12_2_ = sVar30 + 8;
      auVar25._14_2_ = sVar31 + 8;
      pUVar15 = pu1_ref + (ulong)uVar4 + 1;
      auVar55._0_14_ = auVar149._0_14_;
      auVar55[0xe] = auVar149[7];
      auVar55[0xf] = pUVar15[7];
      auVar54._14_2_ = auVar55._14_2_;
      auVar54._0_13_ = auVar149._0_13_;
      auVar54[0xd] = pUVar15[6];
      auVar53._13_3_ = auVar54._13_3_;
      auVar53._0_12_ = auVar149._0_12_;
      auVar53[0xc] = auVar149[6];
      auVar52._12_4_ = auVar53._12_4_;
      auVar52._0_11_ = auVar149._0_11_;
      auVar52[0xb] = pUVar15[5];
      auVar51._11_5_ = auVar52._11_5_;
      auVar51._0_10_ = auVar149._0_10_;
      auVar51[10] = auVar149[5];
      auVar50._10_6_ = auVar51._10_6_;
      auVar50._0_9_ = auVar149._0_9_;
      auVar50[9] = pUVar15[4];
      auVar49._9_7_ = auVar50._9_7_;
      auVar49._0_8_ = auVar149._0_8_;
      auVar49[8] = auVar149[4];
      auVar48._8_8_ = auVar49._8_8_;
      auVar48[7] = pUVar15[3];
      auVar48[6] = auVar149[3];
      auVar48[5] = pUVar15[2];
      auVar48[4] = auVar149[2];
      auVar48[3] = pUVar15[1];
      auVar48[2] = auVar149[1];
      auVar48[0] = auVar149[0];
      auVar48[1] = *pUVar15;
      auVar116 = pmaddubsw(auVar48,auVar92);
      auVar67[1] = pUVar15[8];
      auVar67[0] = auVar23[8];
      auVar67[2] = auVar23[9];
      auVar67[3] = pUVar15[9];
      auVar67[4] = auVar23[10];
      auVar67[5] = pUVar15[10];
      auVar67[6] = auVar23[0xb];
      auVar67[7] = pUVar15[0xb];
      auVar67[8] = auVar23[0xc];
      auVar67[9] = pUVar15[0xc];
      auVar67[10] = auVar23[0xd];
      auVar67[0xb] = pUVar15[0xd];
      auVar67[0xc] = auVar23[0xe];
      auVar67[0xd] = pUVar15[0xe];
      auVar67[0xe] = auVar23[0xf];
      auVar67[0xf] = pUVar15[0xf];
      auVar136 = pmaddubsw(auVar67,auVar159);
      auVar93._0_2_ = sVar64 + -0x108;
      auVar93._2_2_ = sVar69 + -0x108;
      auVar93._4_2_ = sVar70 + -0x108;
      auVar93._6_2_ = sVar71 + -0x108;
      auVar93._8_2_ = sVar72 + -0x108;
      auVar93._10_2_ = sVar73 + -0x108;
      auVar93._12_2_ = sVar74 + -0x108;
      auVar93._14_2_ = sVar75 + -0x108;
      auVar133._0_14_ = auVar23._0_14_;
      auVar133[0xe] = auVar23[7];
      auVar133[0xf] = pUVar15[7];
      auVar132._14_2_ = auVar133._14_2_;
      auVar132._0_13_ = auVar23._0_13_;
      auVar132[0xd] = pUVar15[6];
      auVar131._13_3_ = auVar132._13_3_;
      auVar131._0_12_ = auVar23._0_12_;
      auVar131[0xc] = auVar23[6];
      auVar130._12_4_ = auVar131._12_4_;
      auVar130._0_11_ = auVar23._0_11_;
      auVar130[0xb] = pUVar15[5];
      auVar129._11_5_ = auVar130._11_5_;
      auVar129._0_10_ = auVar23._0_10_;
      auVar129[10] = auVar23[5];
      auVar128._10_6_ = auVar129._10_6_;
      auVar128._0_9_ = auVar23._0_9_;
      auVar128[9] = pUVar15[4];
      auVar127._9_7_ = auVar128._9_7_;
      auVar127._0_8_ = auVar23._0_8_;
      auVar127[8] = auVar23[4];
      auVar126._8_8_ = auVar127._8_8_;
      auVar126[7] = pUVar15[3];
      auVar126[6] = auVar23[3];
      auVar126[5] = pUVar15[2];
      auVar126[4] = auVar23[2];
      auVar126[3] = pUVar15[1];
      auVar126[2] = auVar23[1];
      auVar126[0] = auVar23[0];
      auVar126[1] = *pUVar15;
      auVar146[1] = pUVar15[8];
      auVar146[0] = auVar149[8];
      auVar146[2] = auVar149[9];
      auVar146[3] = pUVar15[9];
      auVar146[4] = auVar149[10];
      auVar146[5] = pUVar15[10];
      auVar146[6] = auVar149[0xb];
      auVar146[7] = pUVar15[0xb];
      auVar146[8] = auVar149[0xc];
      auVar146[9] = pUVar15[0xc];
      auVar146[10] = auVar149[0xd];
      auVar146[0xb] = pUVar15[0xd];
      auVar146[0xc] = auVar149[0xe];
      auVar146[0xd] = pUVar15[0xe];
      auVar146[0xe] = auVar149[0xf];
      auVar146[0xf] = pUVar15[0xf];
      auVar81._0_2_ = sVar97 + 0x108;
      auVar81._2_2_ = sVar99 + 0x108;
      auVar81._4_2_ = sVar26 + 0x108;
      auVar81._6_2_ = sVar27 + 0x108;
      auVar81._8_2_ = sVar28 + 0x108;
      auVar81._10_2_ = sVar29 + 0x108;
      auVar81._12_2_ = sVar30 + 0x108;
      auVar81._14_2_ = sVar31 + 0x108;
      auVar145 = pmaddubsw(auVar146,auVar93);
      auVar158 = pmaddubsw(auVar32,auVar34);
      auVar80 = pmaddubsw(auVar32,auVar25);
      auVar23 = pmaddubsw(auVar32,auVar81);
      auVar149 = pmaddubsw(auVar32,auVar77);
      auVar125 = pmaddubsw(auVar126,auVar36);
      uVar90 = (ushort)(auVar149._0_2_ + sVar91 + auVar125._0_2_) >> 5;
      uVar94 = (ushort)(auVar149._2_2_ + sVar95 + auVar125._2_2_) >> 5;
      uVar96 = (ushort)(auVar149._4_2_ + sVar91 + auVar125._4_2_) >> 5;
      uVar98 = (ushort)(auVar149._6_2_ + sVar95 + auVar125._6_2_) >> 5;
      uVar100 = (ushort)(auVar149._8_2_ + sVar91 + auVar125._8_2_) >> 5;
      uVar101 = (ushort)(auVar149._10_2_ + sVar95 + auVar125._10_2_) >> 5;
      uVar102 = (ushort)(auVar149._12_2_ + sVar91 + auVar125._12_2_) >> 5;
      uVar103 = (ushort)(auVar149._14_2_ + sVar95 + auVar125._14_2_) >> 5;
      uVar107 = (ushort)(auVar80._0_2_ + sVar91 + auVar136._0_2_) >> 5;
      uVar109 = (ushort)(auVar80._2_2_ + sVar95 + auVar136._2_2_) >> 5;
      uVar110 = (ushort)(auVar80._4_2_ + sVar91 + auVar136._4_2_) >> 5;
      uVar111 = (ushort)(auVar80._6_2_ + sVar95 + auVar136._6_2_) >> 5;
      uVar112 = (ushort)(auVar80._8_2_ + sVar91 + auVar136._8_2_) >> 5;
      uVar113 = (ushort)(auVar80._10_2_ + sVar95 + auVar136._10_2_) >> 5;
      uVar114 = (ushort)(auVar80._12_2_ + sVar91 + auVar136._12_2_) >> 5;
      uVar115 = (ushort)(auVar80._14_2_ + sVar95 + auVar136._14_2_) >> 5;
      uVar148 = (ushort)(auVar158._0_2_ + sVar91 + auVar116._0_2_) >> 5;
      uVar161 = (ushort)(auVar158._2_2_ + sVar95 + auVar116._2_2_) >> 5;
      uVar162 = (ushort)(auVar158._4_2_ + sVar91 + auVar116._4_2_) >> 5;
      uVar163 = (ushort)(auVar158._6_2_ + sVar95 + auVar116._6_2_) >> 5;
      uVar164 = (ushort)(auVar158._8_2_ + sVar91 + auVar116._8_2_) >> 5;
      uVar165 = (ushort)(auVar158._10_2_ + sVar95 + auVar116._10_2_) >> 5;
      uVar166 = (ushort)(auVar158._12_2_ + sVar91 + auVar116._12_2_) >> 5;
      uVar167 = (ushort)(auVar158._14_2_ + sVar95 + auVar116._14_2_) >> 5;
      uVar78 = (ushort)(auVar23._0_2_ + sVar91 + auVar145._0_2_) >> 5;
      uVar83 = (ushort)(auVar23._2_2_ + sVar95 + auVar145._2_2_) >> 5;
      uVar84 = (ushort)(auVar23._4_2_ + sVar91 + auVar145._4_2_) >> 5;
      uVar85 = (ushort)(auVar23._6_2_ + sVar95 + auVar145._6_2_) >> 5;
      uVar86 = (ushort)(auVar23._8_2_ + sVar91 + auVar145._8_2_) >> 5;
      uVar87 = (ushort)(auVar23._10_2_ + sVar95 + auVar145._10_2_) >> 5;
      uVar88 = (ushort)(auVar23._12_2_ + sVar91 + auVar145._12_2_) >> 5;
      uVar89 = (ushort)(auVar23._14_2_ + sVar95 + auVar145._14_2_) >> 5;
      *pu1_dst = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
      pu1_dst[1] = (uVar94 != 0) * (uVar94 < 0x100) * (char)uVar94 - (0xff < uVar94);
      pu1_dst[2] = (uVar96 != 0) * (uVar96 < 0x100) * (char)uVar96 - (0xff < uVar96);
      pu1_dst[3] = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
      pu1_dst[4] = (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100);
      pu1_dst[5] = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
      pu1_dst[6] = (uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102);
      pu1_dst[7] = (uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103);
      pu1_dst[8] = (uVar107 != 0) * (uVar107 < 0x100) * (char)uVar107 - (0xff < uVar107);
      pu1_dst[9] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
      pu1_dst[10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)uVar110 - (0xff < uVar110);
      pu1_dst[0xb] = (uVar111 != 0) * (uVar111 < 0x100) * (char)uVar111 - (0xff < uVar111);
      pu1_dst[0xc] = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
      pu1_dst[0xd] = (uVar113 != 0) * (uVar113 < 0x100) * (char)uVar113 - (0xff < uVar113);
      pu1_dst[0xe] = (uVar114 != 0) * (uVar114 < 0x100) * (char)uVar114 - (0xff < uVar114);
      pu1_dst[0xf] = (uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115);
      pUVar15 = pu1_dst + dst_strd;
      *pUVar15 = (uVar148 != 0) * (uVar148 < 0x100) * (char)uVar148 - (0xff < uVar148);
      pUVar15[1] = (uVar161 != 0) * (uVar161 < 0x100) * (char)uVar161 - (0xff < uVar161);
      pUVar15[2] = (uVar162 != 0) * (uVar162 < 0x100) * (char)uVar162 - (0xff < uVar162);
      pUVar15[3] = (uVar163 != 0) * (uVar163 < 0x100) * (char)uVar163 - (0xff < uVar163);
      pUVar15[4] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
      pUVar15[5] = (uVar165 != 0) * (uVar165 < 0x100) * (char)uVar165 - (0xff < uVar165);
      pUVar15[6] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
      pUVar15[7] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
      pUVar15[8] = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
      pUVar15[9] = (uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 - (0xff < uVar83);
      pUVar15[10] = (uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84);
      pUVar15[0xb] = (uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85);
      pUVar15[0xc] = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
      pUVar15[0xd] = (uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87);
      pUVar15[0xe] = (uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88);
      pUVar15[0xf] = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89);
      auVar36._0_2_ = sVar64 + -0x200;
      auVar36._2_2_ = sVar69 + -0x200;
      auVar36._4_2_ = sVar70 + -0x200;
      auVar36._6_2_ = sVar71 + -0x200;
      auVar36._8_2_ = sVar72 + -0x200;
      auVar36._10_2_ = sVar73 + -0x200;
      auVar36._12_2_ = sVar74 + -0x200;
      auVar36._14_2_ = sVar75 + -0x200;
      auVar77._0_2_ = sVar97 + 0x200;
      auVar77._2_2_ = sVar99 + 0x200;
      auVar77._4_2_ = sVar26 + 0x200;
      auVar77._6_2_ = sVar27 + 0x200;
      auVar77._8_2_ = sVar28 + 0x200;
      auVar77._10_2_ = sVar29 + 0x200;
      auVar77._12_2_ = sVar30 + 0x200;
      auVar77._14_2_ = sVar31 + 0x200;
      uVar20 = uVar20 + 2;
      pu1_dst = pu1_dst + (long)dst_strd * 2;
      pbVar19 = pbVar19 + -2;
    } while (uVar20 < 0xe);
  }
  else if (nt == 8) {
    lVar14 = (long)dst_strd;
    uVar20 = 0;
    auVar33 = _DAT_00173f50;
    auVar35 = _DAT_00173f60;
    bVar13 = true;
    uVar18 = uVar4;
    do {
      bVar17 = bVar13;
      auVar116 = pshufb(ZEXT116(pu1_ref[~uVar20 + (ulong)uVar4]),(undefined1  [16])0x0);
      auVar136 = pshufb(ZEXT116(pu1_ref[uVar18 - 2]),(undefined1  [16])0x0);
      auVar149 = pshufb(ZEXT116(pu1_ref[uVar18 - 3]),(undefined1  [16])0x0);
      auVar23 = pshufb(ZEXT116(pu1_ref[uVar18 - 4]),(undefined1  [16])0x0);
      sVar64 = auVar35._0_2_;
      auVar65._0_2_ = sVar64 + -0x100;
      sVar69 = auVar35._2_2_;
      auVar65._2_2_ = sVar69 + -0x100;
      sVar70 = auVar35._4_2_;
      auVar65._4_2_ = sVar70 + -0x100;
      sVar71 = auVar35._6_2_;
      auVar65._6_2_ = sVar71 + -0x100;
      sVar72 = auVar35._8_2_;
      auVar65._8_2_ = sVar72 + -0x100;
      sVar73 = auVar35._10_2_;
      auVar65._10_2_ = sVar73 + -0x100;
      sVar74 = auVar35._12_2_;
      sVar75 = auVar35._14_2_;
      auVar65._12_2_ = sVar74 + -0x100;
      auVar65._14_2_ = sVar75 + -0x100;
      sVar97 = auVar33._0_2_;
      auVar24._0_2_ = sVar97 + 0x100;
      sVar99 = auVar33._2_2_;
      auVar24._2_2_ = sVar99 + 0x100;
      sVar26 = auVar33._4_2_;
      auVar24._4_2_ = sVar26 + 0x100;
      sVar27 = auVar33._6_2_;
      auVar24._6_2_ = sVar27 + 0x100;
      sVar28 = auVar33._8_2_;
      auVar24._8_2_ = sVar28 + 0x100;
      sVar29 = auVar33._10_2_;
      auVar24._10_2_ = sVar29 + 0x100;
      sVar30 = auVar33._12_2_;
      sVar31 = auVar33._14_2_;
      auVar24._12_2_ = sVar30 + 0x100;
      auVar24._14_2_ = sVar31 + 0x100;
      auVar76._0_2_ = sVar64 + -0x200;
      auVar76._2_2_ = sVar69 + -0x200;
      auVar76._4_2_ = sVar70 + -0x200;
      auVar76._6_2_ = sVar71 + -0x200;
      auVar76._8_2_ = sVar72 + -0x200;
      auVar76._10_2_ = sVar73 + -0x200;
      auVar76._12_2_ = sVar74 + -0x200;
      auVar76._14_2_ = sVar75 + -0x200;
      pUVar15 = pu1_ref + (ulong)uVar4 + 1;
      UVar5 = *pUVar15;
      UVar6 = pUVar15[1];
      UVar7 = pUVar15[2];
      UVar8 = pUVar15[3];
      UVar9 = pUVar15[4];
      UVar10 = pUVar15[5];
      UVar11 = pUVar15[6];
      UVar12 = pUVar15[7];
      auVar144._0_14_ = auVar136._0_14_;
      auVar144[0xe] = auVar136[7];
      auVar144[0xf] = UVar12;
      auVar143._14_2_ = auVar144._14_2_;
      auVar143._0_13_ = auVar136._0_13_;
      auVar143[0xd] = UVar11;
      auVar142._13_3_ = auVar143._13_3_;
      auVar142._0_12_ = auVar136._0_12_;
      auVar142[0xc] = auVar136[6];
      auVar141._12_4_ = auVar142._12_4_;
      auVar141._0_11_ = auVar136._0_11_;
      auVar141[0xb] = UVar10;
      auVar140._11_5_ = auVar141._11_5_;
      auVar140._0_10_ = auVar136._0_10_;
      auVar140[10] = auVar136[5];
      auVar139._10_6_ = auVar140._10_6_;
      auVar139._0_9_ = auVar136._0_9_;
      auVar139[9] = UVar9;
      auVar138._9_7_ = auVar139._9_7_;
      auVar138._0_8_ = auVar136._0_8_;
      auVar138[8] = auVar136[4];
      auVar137._8_8_ = auVar138._8_8_;
      auVar137[7] = UVar8;
      auVar137[6] = auVar136[3];
      auVar137[5] = UVar7;
      auVar137[4] = auVar136[2];
      auVar137[3] = UVar6;
      auVar137[2] = auVar136[1];
      auVar137[0] = auVar136[0];
      auVar137[1] = UVar5;
      auVar145 = pmaddubsw(auVar137,auVar65);
      auVar108._0_2_ = sVar97 + 0x200;
      auVar108._2_2_ = sVar99 + 0x200;
      auVar108._4_2_ = sVar26 + 0x200;
      auVar108._6_2_ = sVar27 + 0x200;
      auVar108._8_2_ = sVar28 + 0x200;
      auVar108._10_2_ = sVar29 + 0x200;
      auVar108._12_2_ = sVar30 + 0x200;
      auVar108._14_2_ = sVar31 + 0x200;
      auVar157._0_14_ = auVar149._0_14_;
      auVar157[0xe] = auVar149[7];
      auVar157[0xf] = UVar12;
      auVar156._14_2_ = auVar157._14_2_;
      auVar156._0_13_ = auVar149._0_13_;
      auVar156[0xd] = UVar11;
      auVar155._13_3_ = auVar156._13_3_;
      auVar155._0_12_ = auVar149._0_12_;
      auVar155[0xc] = auVar149[6];
      auVar154._12_4_ = auVar155._12_4_;
      auVar154._0_11_ = auVar149._0_11_;
      auVar154[0xb] = UVar10;
      auVar153._11_5_ = auVar154._11_5_;
      auVar153._0_10_ = auVar149._0_10_;
      auVar153[10] = auVar149[5];
      auVar152._10_6_ = auVar153._10_6_;
      auVar152._0_9_ = auVar149._0_9_;
      auVar152[9] = UVar9;
      auVar151._9_7_ = auVar152._9_7_;
      auVar151._0_8_ = auVar149._0_8_;
      auVar151[8] = auVar149[4];
      auVar150._8_8_ = auVar151._8_8_;
      auVar150[7] = UVar8;
      auVar150[6] = auVar149[3];
      auVar150[5] = UVar7;
      auVar150[4] = auVar149[2];
      auVar150[3] = UVar6;
      auVar150[2] = auVar149[1];
      auVar150[0] = auVar149[0];
      auVar150[1] = UVar5;
      auVar158 = pmaddubsw(auVar150,auVar76);
      auVar66._0_2_ = sVar64 + -0x300;
      auVar66._2_2_ = sVar69 + -0x300;
      auVar66._4_2_ = sVar70 + -0x300;
      auVar66._6_2_ = sVar71 + -0x300;
      auVar66._8_2_ = sVar72 + -0x300;
      auVar66._10_2_ = sVar73 + -0x300;
      auVar66._12_2_ = sVar74 + -0x300;
      auVar66._14_2_ = sVar75 + -0x300;
      auVar124._0_14_ = auVar116._0_14_;
      auVar124[0xe] = auVar116[7];
      auVar124[0xf] = UVar12;
      auVar123._14_2_ = auVar124._14_2_;
      auVar123._0_13_ = auVar116._0_13_;
      auVar123[0xd] = UVar11;
      auVar122._13_3_ = auVar123._13_3_;
      auVar122._0_12_ = auVar116._0_12_;
      auVar122[0xc] = auVar116[6];
      auVar121._12_4_ = auVar122._12_4_;
      auVar121._0_11_ = auVar116._0_11_;
      auVar121[0xb] = UVar10;
      auVar120._11_5_ = auVar121._11_5_;
      auVar120._0_10_ = auVar116._0_10_;
      auVar120[10] = auVar116[5];
      auVar119._10_6_ = auVar120._10_6_;
      auVar119._0_9_ = auVar116._0_9_;
      auVar119[9] = UVar9;
      auVar118._9_7_ = auVar119._9_7_;
      auVar118._0_8_ = auVar116._0_8_;
      auVar118[8] = auVar116[4];
      auVar117._8_8_ = auVar118._8_8_;
      auVar117[7] = UVar8;
      auVar117[6] = auVar116[3];
      auVar117[5] = UVar7;
      auVar117[4] = auVar116[2];
      auVar117[3] = UVar6;
      auVar117[2] = auVar116[1];
      auVar117[0] = auVar116[0];
      auVar117[1] = UVar5;
      auVar47._0_14_ = auVar23._0_14_;
      auVar47[0xe] = auVar23[7];
      auVar47[0xf] = UVar12;
      auVar46._14_2_ = auVar47._14_2_;
      auVar46._0_13_ = auVar23._0_13_;
      auVar46[0xd] = UVar11;
      auVar45._13_3_ = auVar46._13_3_;
      auVar45._0_12_ = auVar23._0_12_;
      auVar45[0xc] = auVar23[6];
      auVar44._12_4_ = auVar45._12_4_;
      auVar44._0_11_ = auVar23._0_11_;
      auVar44[0xb] = UVar10;
      auVar43._11_5_ = auVar44._11_5_;
      auVar43._0_10_ = auVar23._0_10_;
      auVar43[10] = auVar23[5];
      auVar42._10_6_ = auVar43._10_6_;
      auVar42._0_9_ = auVar23._0_9_;
      auVar42[9] = UVar9;
      auVar41._9_7_ = auVar42._9_7_;
      auVar41._0_8_ = auVar23._0_8_;
      auVar41[8] = auVar23[4];
      auVar40._8_8_ = auVar41._8_8_;
      auVar40[7] = UVar8;
      auVar40[6] = auVar23[3];
      auVar40[5] = UVar7;
      auVar40[4] = auVar23[2];
      auVar40[3] = UVar6;
      auVar40[2] = auVar23[1];
      auVar40[0] = auVar23[0];
      auVar40[1] = UVar5;
      auVar79._0_2_ = sVar97 + 0x300;
      auVar79._2_2_ = sVar99 + 0x300;
      auVar79._4_2_ = sVar26 + 0x300;
      auVar79._6_2_ = sVar27 + 0x300;
      auVar79._8_2_ = sVar28 + 0x300;
      auVar79._10_2_ = sVar29 + 0x300;
      auVar79._12_2_ = sVar30 + 0x300;
      auVar79._14_2_ = sVar31 + 0x300;
      auVar116 = pmaddubsw(auVar40,auVar66);
      auVar149 = pmaddubsw(auVar32,auVar24);
      auVar136 = pmaddubsw(auVar32,auVar108);
      auVar23 = pmaddubsw(auVar32,auVar79);
      auVar80 = pmaddubsw(auVar32,auVar33);
      auVar125 = pmaddubsw(auVar117,auVar35);
      uVar78 = (ushort)(auVar80._0_2_ + sVar91 + auVar125._0_2_) >> 4;
      uVar83 = (ushort)(auVar80._2_2_ + sVar95 + auVar125._2_2_) >> 4;
      uVar84 = (ushort)(auVar80._4_2_ + sVar91 + auVar125._4_2_) >> 4;
      uVar85 = (ushort)(auVar80._6_2_ + sVar95 + auVar125._6_2_) >> 4;
      uVar86 = (ushort)(auVar80._8_2_ + sVar91 + auVar125._8_2_) >> 4;
      uVar87 = (ushort)(auVar80._10_2_ + sVar95 + auVar125._10_2_) >> 4;
      uVar88 = (ushort)(auVar80._12_2_ + sVar91 + auVar125._12_2_) >> 4;
      uVar89 = (ushort)(auVar80._14_2_ + sVar95 + auVar125._14_2_) >> 4;
      *(ulong *)(pu1_dst + uVar20 * lVar14) =
           CONCAT17((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    CONCAT16((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                             CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                      (0xff < uVar87),
                                      CONCAT14((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                               (0xff < uVar86),
                                               CONCAT13((uVar85 != 0) * (uVar85 < 0x100) *
                                                        (char)uVar85 - (0xff < uVar85),
                                                        CONCAT12((uVar84 != 0) * (uVar84 < 0x100) *
                                                                 (char)uVar84 - (0xff < uVar84),
                                                                 CONCAT11((uVar83 != 0) *
                                                                          (uVar83 < 0x100) *
                                                                          (char)uVar83 -
                                                                          (0xff < uVar83),
                                                                          (uVar78 != 0) *
                                                                          (uVar78 < 0x100) *
                                                                          (char)uVar78 -
                                                                          (0xff < uVar78))))))));
      uVar78 = (ushort)(auVar149._0_2_ + sVar91 + auVar145._0_2_) >> 4;
      uVar83 = (ushort)(auVar149._2_2_ + sVar95 + auVar145._2_2_) >> 4;
      uVar84 = (ushort)(auVar149._4_2_ + sVar91 + auVar145._4_2_) >> 4;
      uVar85 = (ushort)(auVar149._6_2_ + sVar95 + auVar145._6_2_) >> 4;
      uVar86 = (ushort)(auVar149._8_2_ + sVar91 + auVar145._8_2_) >> 4;
      uVar87 = (ushort)(auVar149._10_2_ + sVar95 + auVar145._10_2_) >> 4;
      uVar88 = (ushort)(auVar149._12_2_ + sVar91 + auVar145._12_2_) >> 4;
      uVar89 = (ushort)(auVar149._14_2_ + sVar95 + auVar145._14_2_) >> 4;
      *(ulong *)(pu1_dst + (uVar20 | 1) * lVar14) =
           CONCAT17((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    CONCAT16((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                             CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                      (0xff < uVar87),
                                      CONCAT14((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                               (0xff < uVar86),
                                               CONCAT13((uVar85 != 0) * (uVar85 < 0x100) *
                                                        (char)uVar85 - (0xff < uVar85),
                                                        CONCAT12((uVar84 != 0) * (uVar84 < 0x100) *
                                                                 (char)uVar84 - (0xff < uVar84),
                                                                 CONCAT11((uVar83 != 0) *
                                                                          (uVar83 < 0x100) *
                                                                          (char)uVar83 -
                                                                          (0xff < uVar83),
                                                                          (uVar78 != 0) *
                                                                          (uVar78 < 0x100) *
                                                                          (char)uVar78 -
                                                                          (0xff < uVar78))))))));
      uVar78 = (ushort)(auVar136._0_2_ + sVar91 + auVar158._0_2_) >> 4;
      uVar83 = (ushort)(auVar136._2_2_ + sVar95 + auVar158._2_2_) >> 4;
      uVar84 = (ushort)(auVar136._4_2_ + sVar91 + auVar158._4_2_) >> 4;
      uVar85 = (ushort)(auVar136._6_2_ + sVar95 + auVar158._6_2_) >> 4;
      uVar86 = (ushort)(auVar136._8_2_ + sVar91 + auVar158._8_2_) >> 4;
      uVar87 = (ushort)(auVar136._10_2_ + sVar95 + auVar158._10_2_) >> 4;
      uVar88 = (ushort)(auVar136._12_2_ + sVar91 + auVar158._12_2_) >> 4;
      uVar89 = (ushort)(auVar136._14_2_ + sVar95 + auVar158._14_2_) >> 4;
      *(ulong *)(pu1_dst + (uVar20 | 2) * lVar14) =
           CONCAT17((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    CONCAT16((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                             CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                      (0xff < uVar87),
                                      CONCAT14((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                               (0xff < uVar86),
                                               CONCAT13((uVar85 != 0) * (uVar85 < 0x100) *
                                                        (char)uVar85 - (0xff < uVar85),
                                                        CONCAT12((uVar84 != 0) * (uVar84 < 0x100) *
                                                                 (char)uVar84 - (0xff < uVar84),
                                                                 CONCAT11((uVar83 != 0) *
                                                                          (uVar83 < 0x100) *
                                                                          (char)uVar83 -
                                                                          (0xff < uVar83),
                                                                          (uVar78 != 0) *
                                                                          (uVar78 < 0x100) *
                                                                          (char)uVar78 -
                                                                          (0xff < uVar78))))))));
      uVar78 = (ushort)(auVar23._0_2_ + sVar91 + auVar116._0_2_) >> 4;
      uVar83 = (ushort)(auVar23._2_2_ + sVar95 + auVar116._2_2_) >> 4;
      uVar84 = (ushort)(auVar23._4_2_ + sVar91 + auVar116._4_2_) >> 4;
      uVar85 = (ushort)(auVar23._6_2_ + sVar95 + auVar116._6_2_) >> 4;
      uVar86 = (ushort)(auVar23._8_2_ + sVar91 + auVar116._8_2_) >> 4;
      uVar87 = (ushort)(auVar23._10_2_ + sVar95 + auVar116._10_2_) >> 4;
      uVar88 = (ushort)(auVar23._12_2_ + sVar91 + auVar116._12_2_) >> 4;
      uVar89 = (ushort)(auVar23._14_2_ + sVar95 + auVar116._14_2_) >> 4;
      *(ulong *)(pu1_dst + (uVar20 | 3) * lVar14) =
           CONCAT17((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    CONCAT16((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                             CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                      (0xff < uVar87),
                                      CONCAT14((uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 -
                                               (0xff < uVar86),
                                               CONCAT13((uVar85 != 0) * (uVar85 < 0x100) *
                                                        (char)uVar85 - (0xff < uVar85),
                                                        CONCAT12((uVar84 != 0) * (uVar84 < 0x100) *
                                                                 (char)uVar84 - (0xff < uVar84),
                                                                 CONCAT11((uVar83 != 0) *
                                                                          (uVar83 < 0x100) *
                                                                          (char)uVar83 -
                                                                          (0xff < uVar83),
                                                                          (uVar78 != 0) *
                                                                          (uVar78 < 0x100) *
                                                                          (char)uVar78 -
                                                                          (0xff < uVar78))))))));
      auVar35._0_2_ = sVar64 + -0x400;
      auVar35._2_2_ = sVar69 + -0x400;
      auVar35._4_2_ = sVar70 + -0x400;
      auVar35._6_2_ = sVar71 + -0x400;
      auVar35._8_2_ = sVar72 + -0x400;
      auVar35._10_2_ = sVar73 + -0x400;
      auVar35._12_2_ = sVar74 + -0x400;
      auVar35._14_2_ = sVar75 + -0x400;
      auVar33._0_2_ = sVar97 + 0x400;
      auVar33._2_2_ = sVar99 + 0x400;
      auVar33._4_2_ = sVar26 + 0x400;
      auVar33._6_2_ = sVar27 + 0x400;
      auVar33._8_2_ = sVar28 + 0x400;
      auVar33._10_2_ = sVar29 + 0x400;
      auVar33._12_2_ = sVar30 + 0x400;
      auVar33._14_2_ = sVar31 + 0x400;
      uVar20 = 4;
      bVar13 = false;
      uVar18 = uVar18 - 4;
    } while (bVar17);
  }
  else if (0 < nt) {
    uVar18 = nt - 1;
    auVar23 = pshuflw(ZEXT116(bVar3),ZEXT116(bVar3),0);
    auVar32 = pshuflw(ZEXT416(uVar18),ZEXT416(uVar18),0);
    uVar20 = 0;
    auVar136 = pmovsxbw(in_XMM2,0x807060504030201);
    auVar149 = pmovsxbw(in_XMM3,0xfcfcfcfcfcfcfcfc);
    auVar80 = pmovsxbw(in_XMM4,0x404040404040404);
    do {
      auVar125 = pshuflw(ZEXT116(pu1_ref[~uVar20 + (ulong)uVar4]),
                         ZEXT116(pu1_ref[~uVar20 + (ulong)uVar4]),0);
      iVar21 = (int)uVar20;
      uVar20 = uVar20 + 1;
      auVar145 = ZEXT416(uVar18 - iVar21);
      auVar145 = pshuflw(auVar145,auVar145,0);
      auVar158 = ZEXT416((int)uVar20 * (uint)bVar2 + nt);
      auVar158 = pshuflw(auVar158,auVar158,0);
      uVar16 = 0;
      auVar82 = auVar136;
      sVar91 = auVar32._0_2_;
      sVar95 = auVar32._2_2_ + -1;
      sVar97 = auVar32._0_2_ + -2;
      sVar99 = auVar32._2_2_ + -3;
      do {
        auVar106 = pmovzxbw(auVar116,*(undefined8 *)(pu1_ref + uVar16 + (ulong)uVar4 + 1));
        sVar26 = auVar145._0_2_;
        auVar116._0_2_ = auVar106._0_2_ * sVar26;
        sVar27 = auVar145._2_2_;
        auVar116._2_2_ = auVar106._2_2_ * sVar27;
        auVar116._4_2_ = auVar106._4_2_ * sVar26;
        auVar116._6_2_ = auVar106._6_2_ * sVar27;
        auVar116._8_2_ = auVar106._8_2_ * sVar26;
        auVar116._10_2_ = auVar106._10_2_ * sVar27;
        auVar116._12_2_ = auVar106._12_2_ * sVar26;
        auVar116._14_2_ = auVar106._14_2_ * sVar27;
        sVar26 = auVar82._2_2_;
        sVar27 = auVar82._4_2_;
        sVar28 = auVar82._6_2_;
        sVar29 = auVar82._8_2_;
        sVar30 = auVar82._10_2_;
        sVar31 = auVar82._12_2_;
        sVar64 = auVar82._14_2_;
        uVar78 = (ushort)(sVar91 * auVar125._0_2_ + auVar158._0_2_ + auVar82._0_2_ * auVar23._0_2_ +
                         auVar116._0_2_) >> 3;
        uVar83 = (ushort)(sVar95 * auVar125._2_2_ + auVar158._2_2_ + sVar26 * auVar23._2_2_ +
                         auVar116._2_2_) >> 3;
        uVar84 = (ushort)(sVar97 * auVar125._0_2_ + auVar158._0_2_ + sVar27 * auVar23._0_2_ +
                         auVar116._4_2_) >> 3;
        uVar85 = (ushort)(sVar99 * auVar125._2_2_ + auVar158._2_2_ + sVar28 * auVar23._2_2_ +
                         auVar116._6_2_) >> 3;
        *(uint *)(pu1_dst + uVar16) =
             CONCAT13((uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85),
                      CONCAT12((uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84),
                               CONCAT11((uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 -
                                        (0xff < uVar83),
                                        (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 -
                                        (0xff < uVar78))));
        sVar91 = sVar91 + auVar149._0_2_;
        sVar95 = sVar95 + auVar149._2_2_;
        sVar97 = sVar97 + auVar149._4_2_;
        sVar99 = sVar99 + auVar149._6_2_;
        auVar82._0_2_ = auVar82._0_2_ + auVar80._0_2_;
        auVar82._2_2_ = sVar26 + auVar80._2_2_;
        auVar82._4_2_ = sVar27 + auVar80._4_2_;
        auVar82._6_2_ = sVar28 + auVar80._6_2_;
        auVar82._8_2_ = sVar29 + auVar80._8_2_;
        auVar82._10_2_ = sVar30 + auVar80._10_2_;
        auVar82._12_2_ = sVar31 + auVar80._12_2_;
        auVar82._14_2_ = sVar64 + auVar80._14_2_;
        uVar16 = uVar16 + 4;
      } while (uVar16 < (uint)nt);
      pu1_dst = pu1_dst + dst_strd;
    } while (uVar20 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_planar_ssse3(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{


    WORD32 row, col;
    WORD32 two_nt, three_nt;
    UWORD16 temp;

    __m128i pu1_ref_16x8b, const_temp_4x32b, const_temp1_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i col_8x16b, const_temp5_4x32b, const_temp6_4x32b, zero_8x16b, const_temp7_4x32b, const_temp8_4x32b;
    __m128i nt_row_16x8b, nt_row1_16x8b, nt_row2_16x8b, nt_row3_16x8b; //nt-1-row
    __m128i row_16x8b, row1_16x8b, row2_16x8b, row3_16x8b; //row+1
    UNUSED(src_strd);
    UNUSED(mode);

    two_nt = 2 * nt;
    three_nt = 3 * nt;

    /* Planar filtering */
    temp = pu1_ref[nt - 1];
    temp = (temp << 8) | ((UWORD16)pu1_ref[three_nt + 1]);
    /* setting vallues in  registera*/
    pu1_ref_16x8b  = _mm_set1_epi16(temp);
    const_temp6_4x32b = _mm_set1_epi16(nt);



    if(nt == 32) /* for nt multiple of 8*/
    {


        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        const_temp8_4x32b = _mm_set1_epi16(0x0008);
        //(nt-1-y) (nt-1-x) ; x= 0..15 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x1f18, 0x1f19, 0x1f1a, 0x1f1b, 0x1f1c, 0x1f1d, 0x1f1e, 0x1f1f);
        //(y+1) (x+1) ; x= 0..15 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 1)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b, src_temp1_8x16b;


            res_temp1_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);

            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp8_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp8_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp8_4x32b);
            row2_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp8_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row2_16x8b, const_temp8_4x32b);
            row3_16x8b    = _mm_add_epi16(row2_16x8b,    const_temp8_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 17));

            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp1_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp1_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 6); //log2(32)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 6);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 6);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 6);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, res_temp1_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp2_8x16b, res_temp3_8x16b);


            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd) + 16), res_temp1_8x16b);


            nt_row_16x8b = _mm_sub_epi16(nt_row_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row_16x8b,    const_temp1_4x32b);
        }
    }
    else if(nt == 16) /* for nt multiple of 8*/
    {

        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        const_temp8_4x32b = _mm_set1_epi16(0x0008);
        //(nt-1-y) (nt-1-x) ; x= 0..15 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x0f08, 0x0f09, 0x0f0a, 0x0f0b, 0x0f0c, 0x0f0d, 0x0f0e, 0x0f0f);
        //(y+1) (x+1) ; x= 0..15 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 2)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b;


            res_temp1_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);
            res_temp2_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 2 - row]);


            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp1_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp1_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp8_4x32b);
            row2_16x8b    = _mm_add_epi16(row_16x8b,     const_temp8_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp8_4x32b);
            row3_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp8_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));


            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpacklo_epi8(res_temp2_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpackhi_epi8(res_temp2_8x16b, src_temp_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 5); //log2(16)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 5);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 5);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 5);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, res_temp2_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, res_temp3_8x16b);

            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), res_temp1_8x16b);

            nt_row_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp1_4x32b);
        }
    }
    else if(nt == 8)
    {


        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        zero_8x16b = _mm_set1_epi32(0);

        //(nt-1-y) (nt-1-x) ; x= 0..7 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x0700, 0x0701, 0x0702, 0x0703, 0x0704, 0x0705, 0x0706, 0x0707);
        //(y+1) (x+1) ; x= 0..7 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 4)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b;


            res_temp4_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);
            res_temp5_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 2 - row]);
            res_temp6_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 3 - row]);
            res_temp7_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 4 - row]);

            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp1_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp1_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp1_4x32b);
            row2_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp1_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row2_16x8b, const_temp1_4x32b);
            row3_16x8b    = _mm_add_epi16(row2_16x8b,    const_temp1_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp4_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpacklo_epi8(res_temp5_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpacklo_epi8(res_temp6_8x16b, src_temp_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpacklo_epi8(res_temp7_8x16b, src_temp_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 4); //log2(16)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 4);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 4);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 4);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, zero_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);
            res_temp2_8x16b = _mm_packus_epi16(res_temp2_8x16b, zero_8x16b);
            res_temp3_8x16b = _mm_packus_epi16(res_temp3_8x16b, zero_8x16b);

            _mm_storel_epi64((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), res_temp1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), res_temp2_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), res_temp3_8x16b);

            nt_row_16x8b = _mm_sub_epi16(nt_row3_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row3_16x8b,    const_temp1_4x32b);
        }
    }
    else
    {

        /* for nt multiple of 4*/
        const_temp7_4x32b = _mm_set1_epi16(4);
        const_temp4_4x32b = _mm_set1_epi16(nt - 1);
        const_temp_4x32b  = _mm_set1_epi16(pu1_ref[three_nt + 1]);
        const_temp1_4x32b = _mm_set1_epi16(pu1_ref[nt - 1]);
        zero_8x16b = _mm_set1_epi32(0);

        for(row = 0; row < nt; row++)
        {
            __m128i res_temp_8x16b, row_8x16b, res_temp1_8x16b, res_temp2_8x16b;
            __m128i res_temp3_8x16b;

            const_temp2_4x32b  = _mm_set1_epi16(pu1_ref[two_nt - 1 - row]);
            const_temp3_4x32b  = _mm_set1_epi16((row + 1));


            row_8x16b = _mm_set1_epi16((nt - 1 - row));

            const_temp5_4x32b = _mm_set_epi16(7, 6, 5, 4, 3, 2, 1, 0);
            col_8x16b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);

            const_temp5_4x32b = _mm_sub_epi16(const_temp4_4x32b, const_temp5_4x32b);

            /*(row + 1) * pu1_ref[nt - 1]*/
            res_temp_8x16b  = _mm_mullo_epi16(const_temp3_4x32b,  const_temp1_4x32b);

            /*(row + 1) * pu1_ref[nt - 1] + nt)*/
            res_temp_8x16b = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);

            for(col = 0; col < nt; col += 4)
            {
                __m128i src_temp_8x16b;
                int temp1;

                /* loding 8bit 16 pixles*/
                src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + col));

                src_temp_8x16b =  _mm_unpacklo_epi8(src_temp_8x16b, zero_8x16b); /* row=0*/

                /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] */
                res_temp1_8x16b  = _mm_mullo_epi16(src_temp_8x16b,  row_8x16b);

                /*(col + 1) * pu1_ref[three_nt + 1]*/
                res_temp2_8x16b  = _mm_mullo_epi16(const_temp_4x32b,  col_8x16b);

                /*(nt - 1 - col)* pu1_ref[two_nt - 1 - row]*/
                res_temp3_8x16b  = _mm_mullo_epi16(const_temp2_4x32b,  const_temp5_4x32b);

                res_temp1_8x16b = _mm_add_epi16(res_temp_8x16b, res_temp1_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp3_8x16b);

                res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 3); //log2(16)+1
                res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);

                temp1 = _mm_cvtsi128_si32(res_temp1_8x16b);

                *(WORD32 *)(&pu1_dst[(row * dst_strd) + col]) = temp1;

                const_temp5_4x32b = _mm_sub_epi16(const_temp5_4x32b, const_temp7_4x32b);
                col_8x16b = _mm_add_epi16(col_8x16b, const_temp7_4x32b);
            } /* inner loop ends here */
        }
    }


}